

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssl_shim.cc
# Opt level: O1

bool CheckHandshakeProperties(SSL *ssl,bool is_resume,TestConfig *config)

{
  ushort uVar1;
  _Alloc_hider _Var2;
  pointer puVar3;
  pointer puVar4;
  pointer ppcVar5;
  bool bVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ssl_early_data_reason_t reason;
  int32_t iVar12;
  TestState *pTVar13;
  SSL_CIPHER *pSVar14;
  char *pcVar15;
  size_t sVar16;
  stack_st_X509 *psVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  char *__format;
  FILE *pFVar21;
  char **ppcVar22;
  bool bVar23;
  size_t peer_params_len;
  uint8_t *next_proto;
  uint next_proto_len;
  size_t peer_settings_len;
  uint8_t *peer_settings;
  uint8_t *alpn_proto;
  uint alpn_proto_len;
  size_t local_c0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_b8 [2];
  TestState *local_78;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  size_t local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint local_34;
  
  pTVar13 = GetTestState(ssl);
  bVar6 = CheckAuthProperties(ssl,is_resume,config);
  if (!bVar6) {
    return false;
  }
  pSVar14 = SSL_get_current_cipher((SSL *)ssl);
  if (pSVar14 == (SSL_CIPHER *)0x0) {
    CheckHandshakeProperties();
    return false;
  }
  if ((config->expect_version != 0) &&
     (uVar9 = SSL_version((SSL *)ssl), uVar9 != config->expect_version)) {
    CheckHandshakeProperties();
    return false;
  }
  bVar6 = false;
  if ((is_resume) && (bVar6 = true, config->expect_session_miss == true)) {
    iVar10 = SSL_in_early_data(ssl);
    bVar6 = iVar10 != 0;
  }
  iVar10 = SSL_session_reused(ssl);
  if (bVar6 != (iVar10 != 0)) {
    CheckHandshakeProperties();
    return false;
  }
  if ((is_resume) || (config->false_start == false)) {
    iVar10 = SSL_in_early_data(ssl);
    bVar6 = iVar10 == 0;
  }
  else {
    bVar6 = false;
  }
  if (pTVar13->handshake_done != bVar6) {
    CheckHandshakeProperties();
    return false;
  }
  if ((bVar6 != false) && (config->is_server == false)) {
    bVar23 = false;
    if ((config->expect_no_session == false) &&
       ((iVar10 = SSL_session_reused(ssl), iVar10 == 0 || (config->expect_ticket_renewal == true))))
    {
      uVar11 = SSL_version((SSL *)ssl);
      iVar10 = SSL_is_dtls(ssl);
      uVar9 = 0x200 - uVar11;
      if (iVar10 == 0) {
        uVar9 = uVar11;
      }
      bVar23 = (uVar9 & 0xffff) < 0x304;
    }
    if (bVar23 != pTVar13->got_new_session) {
      CheckHandshakeProperties();
      return false;
    }
  }
  if (!is_resume) {
    if ((config->expect_session_id == true) && (pTVar13->got_new_session == false)) {
      CheckHandshakeProperties();
      return false;
    }
    if ((config->expect_no_session_id == true) && (pTVar13->got_new_session == true)) {
      CheckHandshakeProperties();
      return false;
    }
  }
  if (((config->handoff == false) && (config->is_server == true)) &&
     (pTVar13->early_callback_called == false)) {
    CheckHandshakeProperties();
    return false;
  }
  local_78 = pTVar13;
  if ((config->expect_server_name)._M_string_length != 0) {
    pcVar15 = SSL_get_servername((SSL *)ssl,0);
    if ((pcVar15 == (char *)0x0) ||
       (iVar10 = std::__cxx11::string::compare((char *)&config->expect_server_name), iVar10 != 0)) {
      fprintf(_stderr,"servername mismatch (got %s; want %s)\n",pcVar15,
              (config->expect_server_name)._M_dataplus._M_p);
      return false;
    }
  }
  if (((config->expect_next_proto)._M_string_length != 0) || (config->expect_no_next_proto == true))
  {
    SSL_get0_next_proto_negotiated((SSL *)ssl,(uchar **)local_b8,(uint *)&local_70);
    sVar19 = (config->expect_next_proto)._M_string_length;
    if ((sVar19 != ((ulong)local_70 & 0xffffffff)) ||
       ((sVar19 != 0 &&
        (iVar10 = bcmp((config->expect_next_proto)._M_dataplus._M_p,
                       local_b8[0].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,sVar19), iVar10 != 0)))) {
      fwrite("negotiated next proto mismatch\n",0x1f,1,_stderr);
      return false;
    }
  }
  bVar23 = config->is_server;
  SSL_get0_alpn_selected(ssl,&local_40,&local_34);
  sVar19 = (&config->expect_alpn)[(ulong)bVar23 * 2]._M_string_length;
  if ((sVar19 != local_34) ||
     ((sVar19 != 0 &&
      (iVar10 = bcmp((&config->expect_alpn)[(ulong)bVar23 * 2]._M_dataplus._M_p,local_40,sVar19),
      iVar10 != 0)))) {
    CheckHandshakeProperties();
    return false;
  }
  uVar9 = SSL_has_application_settings(ssl);
  bVar23 = (config->expect_peer_application_settings).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged;
  if (uVar9 != bVar23) {
    CheckHandshakeProperties();
    return false;
  }
  local_70 = local_60;
  if (bVar23 == false) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  }
  else {
    _Var2._M_p = (config->expect_peer_application_settings).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,_Var2._M_p,
               _Var2._M_p +
               (config->expect_peer_application_settings).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
  }
  SSL_get0_peer_application_settings(ssl,&local_48,&local_50);
  if ((local_68 == local_50) &&
     ((local_68 == 0 || (iVar10 = bcmp(local_70,local_48,local_68), iVar10 == 0)))) {
    if (bVar6 == true &&
        (config->expect_quic_transport_params).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (config->expect_quic_transport_params).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      SSL_get_peer_quic_transport_params(ssl,(uint8_t **)local_b8,&local_c0);
      puVar3 = (config->expect_quic_transport_params).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (config->expect_quic_transport_params).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      sVar19 = (long)puVar4 - (long)puVar3;
      if ((sVar19 != local_c0) ||
         ((puVar4 != puVar3 &&
          (iVar10 = bcmp(puVar3,local_b8[0].
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,sVar19), iVar10 != 0)))) {
        fwrite("QUIC transport params mismatch\n",0x1f,1,_stderr);
        goto LAB_00122d7f;
      }
    }
    if ((config->expect_channel_id).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (config->expect_channel_id).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00122404:
      if ((config->expect_extended_master_secret == true) &&
         (iVar10 = SSL_get_extms_support(ssl), iVar10 == 0)) {
        CheckHandshakeProperties();
      }
      else if ((config->expect_secure_renegotiation == true) &&
              (iVar10 = SSL_get_secure_renegotiation_support(ssl), iVar10 == 0)) {
        CheckHandshakeProperties();
      }
      else {
        if ((config->expect_no_secure_renegotiation != true) ||
           (iVar10 = SSL_get_secure_renegotiation_support(ssl), iVar10 == 0)) {
          uVar8 = config->expect_peer_signature_algorithm;
          if ((uVar8 == 0) ||
             (uVar7 = SSL_get_peer_signature_algorithm(ssl), pFVar21 = _stderr, uVar8 == uVar7)) {
            if (config->expect_curve_id != 0) {
              uVar8 = SSL_get_curve_id(ssl);
              uVar18 = (ulong)config->expect_curve_id;
              if (config->expect_curve_id != uVar8) {
                uVar20 = (ulong)uVar8;
                pcVar15 = "curve_id was %04x, wanted %04x\n";
                pFVar21 = _stderr;
                goto LAB_00122e8a;
              }
            }
            pSVar14 = SSL_get_current_cipher((SSL *)ssl);
            uVar8 = SSL_CIPHER_get_protocol_id((SSL_CIPHER *)pSVar14);
            if (((config->expect_cipher_aes == 0) || (iVar10 = EVP_has_aes_hardware(), iVar10 == 0))
               || (uVar18 = (ulong)config->expect_cipher_aes, config->expect_cipher_aes == uVar8)) {
              if (((config->expect_cipher_no_aes == 0) ||
                  (iVar10 = EVP_has_aes_hardware(), iVar10 != 0)) ||
                 (uVar18 = (ulong)config->expect_cipher_no_aes,
                 config->expect_cipher_no_aes == uVar8)) {
                uVar1 = config->expect_cipher;
                if (uVar1 == uVar8 || uVar1 == 0) {
                  iVar10 = SSL_in_early_data(ssl);
                  if ((iVar10 == 0) && (iVar10 = SSL_is_dtls(ssl), iVar10 == 0)) {
                    if (((config->expect_accept_early_data != true) ||
                        (iVar10 = SSL_early_data_accepted(ssl), iVar10 != 0)) &&
                       ((config->expect_reject_early_data != true ||
                        (iVar10 = SSL_early_data_accepted(ssl), iVar10 == 0)))) {
                      reason = SSL_get_early_data_reason(ssl);
                      pcVar15 = SSL_early_data_reason_string(reason);
                      if ((config->expect_early_data_reason)._M_string_length != 0) {
                        iVar10 = std::__cxx11::string::compare
                                           ((char *)&config->expect_early_data_reason);
                        if (iVar10 != 0) {
                          bVar6 = false;
                          fprintf(_stderr,"Early data reason was \"%s\", expected \"%s\"\n",pcVar15,
                                  (config->expect_early_data_reason)._M_dataplus._M_p);
                          goto LAB_00122d81;
                        }
                      }
                      goto LAB_00122594;
                    }
                    pFVar21 = _stderr;
                    iVar10 = SSL_early_data_accepted(ssl);
                    pcVar15 = "";
                    if (iVar10 == 0) {
                      pcVar15 = " not";
                    }
                    __format = "Early data was%s accepted, but we expected the opposite\n";
                    goto LAB_00122d10;
                  }
LAB_00122594:
                  iVar10 = SSL_is_dtls(ssl);
                  pTVar13 = local_78;
                  if ((iVar10 == 0) || (iVar10 = SSL_in_early_data(ssl), iVar10 == 0)) {
                    if ((config->psk)._M_string_length == 0) {
                      bVar6 = IsPAKE(ssl);
                      if (bVar6) {
                        psVar17 = SSL_get_peer_cert_chain((SSL *)ssl);
                        if (psVar17 == (stack_st_X509 *)0x0) {
LAB_00122625:
                          if (((is_resume) && (config->expect_ticket_age_skew != 0)) &&
                             (iVar12 = SSL_get_ticket_age_skew(ssl), pFVar21 = _stderr,
                             iVar12 != config->expect_ticket_age_skew)) {
                            uVar9 = SSL_get_ticket_age_skew(ssl);
                            uVar18 = (ulong)(uint)config->expect_ticket_age_skew;
                            pcVar15 = "Ticket age skew was %d, wanted %d\n";
                            uVar20 = (ulong)uVar9;
                            goto LAB_00122e8a;
                          }
                          if ((config->expect_selected_credential).
                              super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int>._M_engaged == true) {
                            uVar9 = (config->expect_selected_credential).
                                    super__Optional_base<int,_true,_true>._M_payload.
                                    super__Optional_payload_base<int>._M_payload._M_value;
                            uVar18 = (ulong)uVar9;
                            uVar20 = (ulong)(uint)pTVar13->selected_credential;
                            if (uVar9 != pTVar13->selected_credential) {
                              pcVar15 = "Credential %d was used, wanted %d\n";
                              pFVar21 = _stderr;
                              goto LAB_00122e8a;
                            }
                          }
                          if (((config->expect_hrr == true) &&
                              (iVar10 = SSL_used_hello_retry_request(ssl), iVar10 == 0)) ||
                             ((config->expect_no_hrr == true &&
                              (iVar10 = SSL_used_hello_retry_request(ssl), iVar10 != 0)))) {
                            pFVar21 = _stderr;
                            iVar10 = SSL_used_hello_retry_request(ssl);
                            pcVar15 = "";
                            if (iVar10 == 0) {
                              pcVar15 = "no ";
                            }
                            __format = "Got %sHRR, but wanted opposite.\n";
                          }
                          else {
                            bVar6 = config->expect_ech_accept;
                            iVar10 = SSL_ech_accepted(ssl);
                            pFVar21 = _stderr;
                            if (bVar6 == (iVar10 != 0)) {
                              bVar6 = config->expect_key_usage_invalid;
                              iVar10 = SSL_was_key_usage_invalid(ssl);
                              pFVar21 = _stderr;
                              if (bVar6 == (iVar10 != 0)) {
                                pcVar15 = SSL_get_version((SSL *)ssl);
                                sVar16 = SSL_get_all_version_names((char **)0x0,0);
                                std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                                          (local_b8,sVar16,(allocator_type *)&local_c0);
                                SSL_get_all_version_names
                                          (local_b8[0].
                                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                           (long)local_b8[0].
                                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_b8[0].
                                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                                ppcVar5 = local_b8[0].
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish;
                                ppcVar22 = local_b8[0].
                                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                bVar6 = local_b8[0].
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start !=
                                        local_b8[0].
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish;
                                if (local_b8[0].
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start ==
                                    local_b8[0].
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish) {
LAB_00122c37:
                                  fprintf(_stderr,"Unexpected %s: %s\n","version",pcVar15);
                                }
                                else {
                                  iVar10 = strcmp(*local_b8[0].
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,pcVar15)
                                  ;
                                  while (iVar10 != 0) {
                                    ppcVar22 = ppcVar22 + 1;
                                    bVar6 = ppcVar22 != ppcVar5;
                                    if (ppcVar22 == ppcVar5) goto LAB_00122c37;
                                    iVar10 = strcmp(*ppcVar22,pcVar15);
                                  }
                                }
                                if (local_b8[0].
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start != (char **)0x0) {
                                  operator_delete(local_b8[0].
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_b8[0].
                                                                                                                    
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                if (bVar6) {
                                  pSVar14 = SSL_get_current_cipher((SSL *)ssl);
                                  pcVar15 = SSL_CIPHER_standard_name((SSL_CIPHER *)pSVar14);
                                  sVar16 = SSL_get_all_standard_cipher_names((char **)0x0,0);
                                  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                                            (local_b8,sVar16,(allocator_type *)&local_c0);
                                  SSL_get_all_standard_cipher_names
                                            (local_b8[0].
                                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                             (long)local_b8[0].
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_b8[0].
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
                                  ppcVar5 = local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish;
                                  ppcVar22 = local_b8[0].
                                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                                  bVar6 = local_b8[0].
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start !=
                                          local_b8[0].
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish;
                                  if (local_b8[0].
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start ==
                                      local_b8[0].
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00122dd2:
                                    fprintf(_stderr,"Unexpected %s: %s\n","cipher",pcVar15);
                                  }
                                  else {
                                    iVar10 = strcmp(*local_b8[0].
                                                                                                          
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,pcVar15)
                                    ;
                                    while (iVar10 != 0) {
                                      ppcVar22 = ppcVar22 + 1;
                                      bVar6 = ppcVar22 != ppcVar5;
                                      if (ppcVar22 == ppcVar5) goto LAB_00122dd2;
                                      iVar10 = strcmp(*ppcVar22,pcVar15);
                                    }
                                  }
                                  if (local_b8[0].
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (char **)0x0) {
                                    operator_delete(local_b8[0].
                                                                                                        
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_b8[0].
                                                                                                                    
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if (bVar6) {
                                    pSVar14 = SSL_get_current_cipher((SSL *)ssl);
                                    pcVar15 = SSL_CIPHER_get_name(pSVar14);
                                    sVar16 = SSL_get_all_cipher_names((char **)0x0,0);
                                    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                                              (local_b8,sVar16,(allocator_type *)&local_c0);
                                    SSL_get_all_cipher_names
                                              (local_b8[0].
                                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                               (long)local_b8[0].
                                                                                                          
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_b8[0].
                                                                                                          
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
                                    ppcVar5 = local_b8[0].
                                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish;
                                    ppcVar22 = local_b8[0].
                                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start;
                                    bVar6 = local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start !=
                                            local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish;
                                    if (local_b8[0].
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start ==
                                        local_b8[0].
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00122e23:
                                      fprintf(_stderr,"Unexpected %s: %s\n","OpenSSL cipher name",
                                              pcVar15);
                                    }
                                    else {
                                      iVar10 = strcmp(*local_b8[0].
                                                                                                              
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,pcVar15)
                                      ;
                                      while (iVar10 != 0) {
                                        ppcVar22 = ppcVar22 + 1;
                                        bVar6 = ppcVar22 != ppcVar5;
                                        if (ppcVar22 == ppcVar5) goto LAB_00122e23;
                                        iVar10 = strcmp(*ppcVar22,pcVar15);
                                      }
                                    }
                                    if (local_b8[0].
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start != (char **)0x0) {
                                      operator_delete(local_b8[0].
                                                                                                            
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_b8[0].
                                                                                                                    
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                    }
                                    pTVar13 = local_78;
                                    if (bVar6) {
                                      uVar8 = SSL_get_group_id(ssl);
                                      if (uVar8 != 0) {
                                        uVar8 = SSL_get_group_id(ssl);
                                        pcVar15 = SSL_get_group_name(uVar8);
                                        sVar16 = SSL_get_all_group_names((char **)0x0,0);
                                        std::vector<const_char_*,_std::allocator<const_char_*>_>::
                                        vector(local_b8,sVar16,(allocator_type *)&local_c0);
                                        SSL_get_all_group_names
                                                  (local_b8[0].
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
                                        ppcVar5 = local_b8[0].
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                        ppcVar22 = local_b8[0].
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                        bVar6 = local_b8[0].
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                local_b8[0].
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish;
                                        if (local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start ==
                                            local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00122ed2:
                                          fprintf(_stderr,"Unexpected %s: %s\n","group",pcVar15);
                                        }
                                        else {
                                          iVar10 = strcmp(*local_b8[0].
                                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,pcVar15)
                                          ;
                                          while (iVar10 != 0) {
                                            ppcVar22 = ppcVar22 + 1;
                                            bVar6 = ppcVar22 != ppcVar5;
                                            if (ppcVar22 == ppcVar5) goto LAB_00122ed2;
                                            iVar10 = strcmp(*ppcVar22,pcVar15);
                                          }
                                        }
                                        if (local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start !=
                                            (char **)0x0) {
                                          operator_delete(local_b8[0].
                                                                                                                    
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_b8[0].
                                                                                                                    
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                        }
                                        pTVar13 = local_78;
                                        if (!bVar6) goto LAB_00122d7f;
                                      }
                                      uVar8 = SSL_get_peer_signature_algorithm(ssl);
                                      if (uVar8 != 0) {
                                        uVar8 = SSL_get_peer_signature_algorithm(ssl);
                                        pcVar15 = SSL_get_signature_algorithm_name(uVar8,0);
                                        sVar16 = SSL_get_all_signature_algorithm_names
                                                           ((char **)0x0,0);
                                        std::vector<const_char_*,_std::allocator<const_char_*>_>::
                                        vector(local_b8,sVar16,(allocator_type *)&local_c0);
                                        SSL_get_all_signature_algorithm_names
                                                  (local_b8[0].
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
                                        ppcVar5 = local_b8[0].
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                        ppcVar22 = local_b8[0].
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                        bVar6 = local_b8[0].
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                local_b8[0].
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish;
                                        if (local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start ==
                                            local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00122f57:
                                          fprintf(_stderr,"Unexpected %s: %s\n","sigalg",pcVar15);
                                        }
                                        else {
                                          iVar10 = strcmp(*local_b8[0].
                                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,pcVar15)
                                          ;
                                          while (iVar10 != 0) {
                                            ppcVar22 = ppcVar22 + 1;
                                            bVar6 = ppcVar22 != ppcVar5;
                                            if (ppcVar22 == ppcVar5) goto LAB_00122f57;
                                            iVar10 = strcmp(*ppcVar22,pcVar15);
                                          }
                                        }
                                        if (local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start !=
                                            (char **)0x0) {
                                          operator_delete(local_b8[0].
                                                                                                                    
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_b8[0].
                                                                                                                    
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                        }
                                        pTVar13 = local_78;
                                        if (!bVar6) goto LAB_00122d7f;
                                      }
                                      uVar8 = SSL_get_peer_signature_algorithm(ssl);
                                      if (uVar8 != 0) {
                                        uVar8 = SSL_get_peer_signature_algorithm(ssl);
                                        pcVar15 = SSL_get_signature_algorithm_name(uVar8,1);
                                        sVar16 = SSL_get_all_signature_algorithm_names
                                                           ((char **)0x0,0);
                                        std::vector<const_char_*,_std::allocator<const_char_*>_>::
                                        vector(local_b8,sVar16,(allocator_type *)&local_c0);
                                        SSL_get_all_signature_algorithm_names
                                                  (local_b8[0].
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
                                        ppcVar22 = local_b8[0].
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                        bVar6 = local_b8[0].
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                local_b8[0].
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish;
                                        if (local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start ==
                                            local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00122f7e:
                                          fprintf(_stderr,"Unexpected %s: %s\n","sigalg with curve",
                                                  pcVar15);
                                        }
                                        else {
                                          iVar10 = strcmp(*local_b8[0].
                                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,pcVar15)
                                          ;
                                          while (iVar10 != 0) {
                                            ppcVar22 = ppcVar22 + 1;
                                            bVar6 = ppcVar22 !=
                                                    local_b8[0].
                                                                                                        
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                            if (ppcVar22 ==
                                                local_b8[0].
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish)
                                            goto LAB_00122f7e;
                                            iVar10 = strcmp(*ppcVar22,pcVar15);
                                          }
                                        }
                                        if (local_b8[0].
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start !=
                                            (char **)0x0) {
                                          operator_delete(local_b8[0].
                                                                                                                    
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b8[0].
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_b8[0].
                                                                                                                    
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                        }
                                        pTVar13 = local_78;
                                        if (!bVar6) goto LAB_00122d7f;
                                      }
                                      bVar6 = true;
                                      if ((config->handshake_hints != true) ||
                                         (config->allow_hint_mismatch != false)) goto LAB_00122d81;
                                      iVar10 = SSL_version((SSL *)ssl);
                                      if (iVar10 == 0x304) {
                                        iVar10 = SSL_used_hello_retry_request(ssl);
                                        bVar23 = iVar10 != 0;
                                      }
                                      else {
                                        pSVar14 = SSL_get_current_cipher((SSL *)ssl);
                                        iVar10 = SSL_CIPHER_get_kx_nid((SSL_CIPHER *)pSVar14);
                                        bVar23 = iVar10 == 0x3b7;
                                      }
                                      if ((bVar23) || (pTVar13->used_private_key != true)) {
                                        if (pTVar13->ticket_decrypt_done != true) goto LAB_00122d81;
                                        CheckHandshakeProperties();
                                      }
                                      else {
                                        CheckHandshakeProperties();
                                      }
                                    }
                                  }
                                }
                                goto LAB_00122d7f;
                              }
                              iVar10 = SSL_was_key_usage_invalid(ssl);
                              pcVar15 = "in";
                              if (iVar10 == 0) {
                                pcVar15 = "";
                              }
                              __format = "X.509 key usage was %svalid, but wanted opposite.\n";
                            }
                            else {
                              iVar10 = SSL_ech_accepted(ssl);
                              pcVar15 = "";
                              if (iVar10 == 0) {
                                pcVar15 = "not ";
                              }
                              __format = "ECH was %saccepted, but wanted opposite.\n";
                            }
                          }
LAB_00122d10:
                          bVar6 = false;
                          fprintf(pFVar21,__format,pcVar15);
                          goto LAB_00122d81;
                        }
                        CheckHandshakeProperties();
                      }
                      else {
                        if (((config->is_server == true) &&
                            (config->require_any_client_certificate != true)) ||
                           (psVar17 = SSL_get_peer_cert_chain((SSL *)ssl),
                           psVar17 != (stack_st_X509 *)0x0)) goto LAB_00122625;
                        CheckHandshakeProperties();
                      }
                    }
                    else {
                      psVar17 = SSL_get_peer_cert_chain((SSL *)ssl);
                      if (psVar17 == (stack_st_X509 *)0x0) goto LAB_00122625;
                      CheckHandshakeProperties();
                    }
                  }
                  else {
                    CheckHandshakeProperties();
                  }
                  goto LAB_00122d7f;
                }
                uVar18 = (ulong)uVar1;
                uVar20 = (ulong)uVar8;
                pcVar15 = "Cipher ID was %04x, wanted %04x\n";
                pFVar21 = _stderr;
              }
              else {
                uVar20 = (ulong)uVar8;
                pcVar15 = "Cipher ID was %04x, wanted %04x (no AES hardware)\n";
                pFVar21 = _stderr;
              }
            }
            else {
              uVar20 = (ulong)uVar8;
              pcVar15 = "Cipher ID was %04x, wanted %04x (has AES hardware)\n";
              pFVar21 = _stderr;
            }
          }
          else {
            uVar8 = SSL_get_peer_signature_algorithm(ssl);
            uVar20 = (ulong)uVar8;
            uVar18 = (ulong)config->expect_peer_signature_algorithm;
            pcVar15 = "Peer signature algorithm was %04x, wanted %04x.\n";
          }
LAB_00122e8a:
          bVar6 = false;
          fprintf(pFVar21,pcVar15,uVar20,uVar18);
          goto LAB_00122d81;
        }
        CheckHandshakeProperties();
      }
    }
    else {
      sVar16 = SSL_get_tls_channel_id(ssl,(uint8_t *)local_b8,0x40);
      if (sVar16 == 0) {
        CheckHandshakeProperties();
      }
      else {
        puVar3 = (config->expect_channel_id).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((long)(config->expect_channel_id).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar3 == 0x40) &&
           (iVar10 = bcmp(puVar3,local_b8,0x40), iVar10 == 0)) goto LAB_00122404;
        CheckHandshakeProperties();
      }
    }
  }
  else {
    CheckHandshakeProperties();
  }
LAB_00122d7f:
  bVar6 = false;
LAB_00122d81:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
    return bVar6;
  }
  return bVar6;
}

Assistant:

static bool CheckHandshakeProperties(SSL *ssl, bool is_resume,
                                     const TestConfig *config) {
  TestState *state = GetTestState(ssl);
  if (!CheckAuthProperties(ssl, is_resume, config)) {
    return false;
  }

  if (SSL_get_current_cipher(ssl) == nullptr) {
    fprintf(stderr, "null cipher after handshake\n");
    return false;
  }

  if (config->expect_version != 0 &&
      SSL_version(ssl) != int{config->expect_version}) {
    fprintf(stderr, "want version %04x, got %04x\n", config->expect_version,
            static_cast<uint16_t>(SSL_version(ssl)));
    return false;
  }

  bool expect_resume =
      is_resume && (!config->expect_session_miss || SSL_in_early_data(ssl));
  if (!!SSL_session_reused(ssl) != expect_resume) {
    fprintf(stderr, "session unexpectedly was%s reused\n",
            SSL_session_reused(ssl) ? "" : " not");
    return false;
  }

  bool expect_handshake_done =
      (is_resume || !config->false_start) && !SSL_in_early_data(ssl);
  if (expect_handshake_done != state->handshake_done) {
    fprintf(stderr, "handshake was%s completed\n",
            state->handshake_done ? "" : " not");
    return false;
  }

  if (expect_handshake_done && !config->is_server) {
    bool expect_new_session =
        !config->expect_no_session &&
        (!SSL_session_reused(ssl) || config->expect_ticket_renewal) &&
        // Session tickets are sent post-handshake in TLS 1.3.
        GetProtocolVersion(ssl) < TLS1_3_VERSION;
    if (expect_new_session != state->got_new_session) {
      fprintf(stderr,
              "new session was%s cached, but we expected the opposite\n",
              state->got_new_session ? "" : " not");
      return false;
    }
  }

  if (!is_resume) {
    if (config->expect_session_id && !state->got_new_session) {
      fprintf(stderr, "session was not cached on the server.\n");
      return false;
    }
    if (config->expect_no_session_id && state->got_new_session) {
      fprintf(stderr, "session was unexpectedly cached on the server.\n");
      return false;
    }
  }

  // early_callback_called is updated in the handshaker, so we don't see it
  // here.
  if (!config->handoff && config->is_server && !state->early_callback_called) {
    fprintf(stderr, "early callback not called\n");
    return false;
  }

  if (!config->expect_server_name.empty()) {
    const char *server_name =
        SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);
    if (server_name == nullptr || server_name != config->expect_server_name) {
      fprintf(stderr, "servername mismatch (got %s; want %s)\n", server_name,
              config->expect_server_name.c_str());
      return false;
    }
  }

  if (!config->expect_next_proto.empty() || config->expect_no_next_proto) {
    const uint8_t *next_proto;
    unsigned next_proto_len;
    SSL_get0_next_proto_negotiated(ssl, &next_proto, &next_proto_len);
    if (bssl::StringAsBytes(config->expect_next_proto) !=
        bssl::Span(next_proto, next_proto_len)) {
      fprintf(stderr, "negotiated next proto mismatch\n");
      return false;
    }
  }

  // On the server, the protocol selected in the ALPN callback must be echoed
  // out of |SSL_get0_alpn_selected|. On the client, it should report what the
  // test expected.
  const std::string &expect_alpn =
      config->is_server ? config->select_alpn : config->expect_alpn;
  const uint8_t *alpn_proto;
  unsigned alpn_proto_len;
  SSL_get0_alpn_selected(ssl, &alpn_proto, &alpn_proto_len);
  if (bssl::StringAsBytes(expect_alpn) !=
      bssl::Span(alpn_proto, alpn_proto_len)) {
    fprintf(stderr, "negotiated alpn proto mismatch\n");
    return false;
  }

  if (SSL_has_application_settings(ssl) !=
      (config->expect_peer_application_settings ? 1 : 0)) {
    fprintf(stderr,
            "connection %s application settings, but expected the opposite\n",
            SSL_has_application_settings(ssl) ? "has" : "does not have");
    return false;
  }
  std::string expect_settings = config->expect_peer_application_settings
                                    ? *config->expect_peer_application_settings
                                    : "";
  const uint8_t *peer_settings;
  size_t peer_settings_len;
  SSL_get0_peer_application_settings(ssl, &peer_settings, &peer_settings_len);
  if (bssl::StringAsBytes(expect_settings) !=
      bssl::Span(peer_settings, peer_settings_len)) {
    fprintf(stderr, "peer application settings mismatch\n");
    return false;
  }

  if (!config->expect_quic_transport_params.empty() && expect_handshake_done) {
    const uint8_t *peer_params;
    size_t peer_params_len;
    SSL_get_peer_quic_transport_params(ssl, &peer_params, &peer_params_len);
    if (bssl::Span(config->expect_quic_transport_params) !=
        bssl::Span(peer_params, peer_params_len)) {
      fprintf(stderr, "QUIC transport params mismatch\n");
      return false;
    }
  }

  if (!config->expect_channel_id.empty()) {
    uint8_t channel_id[64];
    if (!SSL_get_tls_channel_id(ssl, channel_id, sizeof(channel_id))) {
      fprintf(stderr, "no channel id negotiated\n");
      return false;
    }
    if (bssl::Span(config->expect_channel_id) != channel_id) {
      fprintf(stderr, "channel id mismatch\n");
      return false;
    }
  }

  if (config->expect_extended_master_secret && !SSL_get_extms_support(ssl)) {
    fprintf(stderr, "No EMS for connection when expected\n");
    return false;
  }

  if (config->expect_secure_renegotiation &&
      !SSL_get_secure_renegotiation_support(ssl)) {
    fprintf(stderr, "No secure renegotiation for connection when expected\n");
    return false;
  }

  if (config->expect_no_secure_renegotiation &&
      SSL_get_secure_renegotiation_support(ssl)) {
    fprintf(stderr,
            "Secure renegotiation unexpectedly negotiated for connection\n");
    return false;
  }

  if (config->expect_peer_signature_algorithm != 0 &&
      config->expect_peer_signature_algorithm !=
          SSL_get_peer_signature_algorithm(ssl)) {
    fprintf(stderr, "Peer signature algorithm was %04x, wanted %04x.\n",
            SSL_get_peer_signature_algorithm(ssl),
            config->expect_peer_signature_algorithm);
    return false;
  }

  if (config->expect_curve_id != 0) {
    uint16_t curve_id = SSL_get_curve_id(ssl);
    if (config->expect_curve_id != curve_id) {
      fprintf(stderr, "curve_id was %04x, wanted %04x\n", curve_id,
              config->expect_curve_id);
      return false;
    }
  }

  uint16_t cipher_id = SSL_CIPHER_get_protocol_id(SSL_get_current_cipher(ssl));
  if (config->expect_cipher_aes != 0 && EVP_has_aes_hardware() &&
      config->expect_cipher_aes != cipher_id) {
    fprintf(stderr, "Cipher ID was %04x, wanted %04x (has AES hardware)\n",
            cipher_id, config->expect_cipher_aes);
    return false;
  }

  if (config->expect_cipher_no_aes != 0 && !EVP_has_aes_hardware() &&
      config->expect_cipher_no_aes != cipher_id) {
    fprintf(stderr, "Cipher ID was %04x, wanted %04x (no AES hardware)\n",
            cipher_id, config->expect_cipher_no_aes);
    return false;
  }

  if (config->expect_cipher != 0 && config->expect_cipher != cipher_id) {
    fprintf(stderr, "Cipher ID was %04x, wanted %04x\n", cipher_id,
            config->expect_cipher);
    return false;
  }

  // The early data status is only applicable after the handshake is confirmed.
  if (!SSL_in_early_data(ssl) && !SSL_is_dtls(ssl)) {
    if ((config->expect_accept_early_data && !SSL_early_data_accepted(ssl)) ||
        (config->expect_reject_early_data && SSL_early_data_accepted(ssl))) {
      fprintf(stderr,
              "Early data was%s accepted, but we expected the opposite\n",
              SSL_early_data_accepted(ssl) ? "" : " not");
      return false;
    }

    const char *early_data_reason =
        SSL_early_data_reason_string(SSL_get_early_data_reason(ssl));
    if (!config->expect_early_data_reason.empty() &&
        config->expect_early_data_reason != early_data_reason) {
      fprintf(stderr, "Early data reason was \"%s\", expected \"%s\"\n",
              early_data_reason, config->expect_early_data_reason.c_str());
      return false;
    }
  }

  if (SSL_is_dtls(ssl) && SSL_in_early_data(ssl)) {
    // TODO(crbug.com/381113363): Support early data for DTLS 1.3.
    fprintf(stderr, "DTLS unexpectedly in early data\n");
    return false;
  }

  if (!config->psk.empty()) {
    if (SSL_get_peer_cert_chain(ssl) != nullptr) {
      fprintf(stderr, "Received peer certificate on a PSK cipher.\n");
      return false;
    }
  } else if (IsPAKE(ssl)) {
    if (SSL_get_peer_cert_chain(ssl) != nullptr) {
      fprintf(stderr, "Received peer certificate on a PAKE handshake.\n");
      return false;
    }
  } else if (!config->is_server || config->require_any_client_certificate) {
    if (SSL_get_peer_cert_chain(ssl) == nullptr) {
      fprintf(stderr, "Received no peer certificate but expected one.\n");
      return false;
    }
  }

  if (is_resume && config->expect_ticket_age_skew != 0 &&
      SSL_get_ticket_age_skew(ssl) != config->expect_ticket_age_skew) {
    fprintf(stderr, "Ticket age skew was %" PRId32 ", wanted %d\n",
            SSL_get_ticket_age_skew(ssl), config->expect_ticket_age_skew);
    return false;
  }

  if (config->expect_selected_credential.has_value() &&
      *config->expect_selected_credential != state->selected_credential) {
    fprintf(stderr, "Credential %d was used, wanted %d\n",
            state->selected_credential, *config->expect_selected_credential);
    return false;
  }

  if ((config->expect_hrr && !SSL_used_hello_retry_request(ssl)) ||
      (config->expect_no_hrr && SSL_used_hello_retry_request(ssl))) {
    fprintf(stderr, "Got %sHRR, but wanted opposite.\n",
            SSL_used_hello_retry_request(ssl) ? "" : "no ");
    return false;
  }

  if (config->expect_ech_accept != !!SSL_ech_accepted(ssl)) {
    fprintf(stderr, "ECH was %saccepted, but wanted opposite.\n",
            SSL_ech_accepted(ssl) ? "" : "not ");
    return false;
  }

  if (config->expect_key_usage_invalid != !!SSL_was_key_usage_invalid(ssl)) {
    fprintf(stderr, "X.509 key usage was %svalid, but wanted opposite.\n",
            SSL_was_key_usage_invalid(ssl) ? "in" : "");
    return false;
  }

  // Check all the selected parameters are covered by the string APIs.
  if (!CheckListContains("version", SSL_get_all_version_names,
                         SSL_get_version(ssl)) ||
      !CheckListContains(
          "cipher", SSL_get_all_standard_cipher_names,
          SSL_CIPHER_standard_name(SSL_get_current_cipher(ssl))) ||
      !CheckListContains("OpenSSL cipher name", SSL_get_all_cipher_names,
                         SSL_CIPHER_get_name(SSL_get_current_cipher(ssl))) ||
      (SSL_get_group_id(ssl) != 0 &&
       !CheckListContains("group", SSL_get_all_group_names,
                          SSL_get_group_name(SSL_get_group_id(ssl)))) ||
      (SSL_get_peer_signature_algorithm(ssl) != 0 &&
       !CheckListContains(
           "sigalg", SSL_get_all_signature_algorithm_names,
           SSL_get_signature_algorithm_name(
               SSL_get_peer_signature_algorithm(ssl), /*include_curve=*/0))) ||
      (SSL_get_peer_signature_algorithm(ssl) != 0 &&
       !CheckListContains(
           "sigalg with curve", SSL_get_all_signature_algorithm_names,
           SSL_get_signature_algorithm_name(
               SSL_get_peer_signature_algorithm(ssl), /*include_curve=*/1)))) {
    return false;
  }

  // Test that handshake hints correctly skipped the expected operations.
  if (config->handshake_hints && !config->allow_hint_mismatch) {
    // If the private key operation is performed in the first roundtrip, a hint
    // match should have skipped it. This is ECDHE-based cipher suites in TLS
    // 1.2 and non-HRR handshakes in TLS 1.3.
    bool private_key_allowed;
    if (SSL_version(ssl) == TLS1_3_VERSION) {
      private_key_allowed = SSL_used_hello_retry_request(ssl);
    } else {
      private_key_allowed =
          SSL_CIPHER_get_kx_nid(SSL_get_current_cipher(ssl)) == NID_kx_rsa;
    }
    if (!private_key_allowed && state->used_private_key) {
      fprintf(
          stderr,
          "Performed private key operation, but hint should have skipped it\n");
      return false;
    }

    if (state->ticket_decrypt_done) {
      fprintf(stderr,
              "Performed ticket decryption, but hint should have skipped it\n");
      return false;
    }

    // TODO(davidben): Decide what we want to do with TLS 1.2 stateful
    // resumption.
  }
  return true;
}